

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Float pbrt::Determinant<3>(SquareMatrix<3> *m)

{
  float *pfVar1;
  float fVar2;
  Float minor01;
  Float minor02;
  Float minor12;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  float b;
  undefined4 in_stack_fffffffffffffec4;
  float a;
  float in_stack_fffffffffffffec8;
  float d;
  float in_stack_fffffffffffffecc;
  float c;
  float in_stack_fffffffffffffed0;
  float b_00;
  float in_stack_fffffffffffffed4;
  float a_00;
  span<const_float> local_110;
  span<const_float> local_100;
  span<const_float> local_f0;
  span<const_float> local_e0;
  span<const_float> local_d0;
  span<const_float> local_c0;
  span<const_float> local_b0;
  float local_9c;
  span<const_float> local_98;
  span<const_float> local_88;
  span<const_float> local_78;
  span<const_float> local_68;
  float local_54;
  span<const_float> local_50;
  span<const_float> local_40;
  span<const_float> local_30;
  span<const_float> local_20;
  float local_c;
  
  local_20 = SquareMatrix<3>::operator[]
                       ((SquareMatrix<3> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        in_stack_fffffffffffffebc);
  pfVar1 = pstd::span<const_float>::operator[](&local_20,1);
  fVar2 = *pfVar1;
  local_30 = SquareMatrix<3>::operator[]
                       ((SquareMatrix<3> *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_30,2);
  b = *pfVar1;
  local_40 = SquareMatrix<3>::operator[]
                       ((SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffffec4,b),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_40,2);
  a = *pfVar1;
  local_50 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_50,1);
  local_c = DifferenceOfProducts<float,float,float,float>
                      (in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc
                       ,in_stack_fffffffffffffec8);
  local_68 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_68,0);
  d = *pfVar1;
  local_78 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_78,2);
  c = *pfVar1;
  local_88 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_88,2);
  b_00 = *pfVar1;
  local_98 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_98,0);
  local_54 = DifferenceOfProducts<float,float,float,float>(in_stack_fffffffffffffed4,b_00,c,d);
  local_b0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pfVar1 = pstd::span<const_float>::operator[](&local_b0,0);
  a_00 = *pfVar1;
  local_c0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_c0,1);
  local_d0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_d0,1);
  local_e0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_e0,0);
  local_9c = DifferenceOfProducts<float,float,float,float>(a_00,b_00,c,d);
  local_f0 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_f0,2);
  local_100 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_100,0);
  local_110 = SquareMatrix<3>::operator[]((SquareMatrix<3> *)CONCAT44(a,b),(int)fVar2);
  pstd::span<const_float>::operator[](&local_110,1);
  DifferenceOfProducts<float,float,float,float>(a_00,b_00,c,d);
  fVar2 = FMA(a,b,fVar2);
  return fVar2;
}

Assistant:

PBRT_CPU_GPU inline Float Determinant(const SquareMatrix<3> &m) {
    Float minor12 = DifferenceOfProducts(m[1][1], m[2][2], m[1][2], m[2][1]);
    Float minor02 = DifferenceOfProducts(m[1][0], m[2][2], m[1][2], m[2][0]);
    Float minor01 = DifferenceOfProducts(m[1][0], m[2][1], m[1][1], m[2][0]);
    return FMA(m[0][2], minor01,
               DifferenceOfProducts(m[0][0], minor12, m[0][1], minor02));
}